

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef17::SeedPeriodic(CSHA512 *hasher,RNGState *rng)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  milliseconds dur;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  uint64_t old_size;
  Level in_stack_00000100;
  unsigned_long *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  __native_type *in_stack_ffffffffffffff68;
  CSHA512 *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  LogFlags in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  __native_type local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SeedFast((CSHA512 *)0x21051c);
  SeedTimestamp((CSHA512 *)0x210526);
  RNGState::SeedEvents
            ((RNGState *)&in_stack_ffffffffffffff68->__data,(CSHA512 *)in_stack_ffffffffffffff60);
  uVar2 = CSHA512::Size((CSHA512 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  RandAddDynamicEnv(in_stack_ffffffffffffff70);
  bVar1 = LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    uVar3 = CSHA512::Size((CSHA512 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_30.__align = uVar3 - uVar2;
    in_stack_ffffffffffffff68 = &local_30;
    in_stack_ffffffffffffff60 = "Feeding %i bytes of dynamic environment data into RNG\n";
    in_stack_ffffffffffffff58 = 1;
    LogPrintFormatInternal<unsigned_long>
              (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0,in_stack_00000100,in_stack_00000008,in_stack_00000110);
  }
  dur = ms<(char)49,(char)48>();
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff60,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  SeedStrengthen(in_RDI,(RNGState *)&in_stack_ffffffffffffff68->__data,(duration)dur.__r);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SeedPeriodic(CSHA512& hasher, RNGState& rng) noexcept
{
    // Everything that the 'fast' seeder includes
    SeedFast(hasher);

    // High-precision timestamp
    SeedTimestamp(hasher);

    // Add the events hasher into the mix
    rng.SeedEvents(hasher);

    // Dynamic environment data (performance monitoring, ...)
    auto old_size = hasher.Size();
    RandAddDynamicEnv(hasher);
    LogDebug(BCLog::RAND, "Feeding %i bytes of dynamic environment data into RNG\n", hasher.Size() - old_size);

    // Strengthen for 10 ms
    SeedStrengthen(hasher, rng, 10ms);
}